

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

size_type __thiscall wabt::string_view::find_last_of(string_view *this,string_view s,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  
  sVar4 = s.size_;
  uVar6 = this->size_ - 1;
  if (pos <= uVar6) {
    uVar6 = pos;
  }
  pcVar1 = this->data_;
  for (pcVar3 = pcVar1 + uVar6 + 1; pcVar5 = pcVar1, pcVar3 != pcVar1; pcVar3 = pcVar3 + -1) {
    if (sVar4 != 0) {
      pcVar5 = pcVar3;
      if (pcVar3[-1] == *s.data_) break;
      sVar2 = 1;
      do {
        sVar7 = sVar2;
        if (sVar4 == sVar7) goto LAB_00131624;
        sVar2 = sVar7 + 1;
      } while (pcVar3[-1] != s.data_[sVar7]);
      if (sVar4 != sVar7) break;
    }
LAB_00131624:
  }
  pcVar3 = (char *)0xffffffffffffffff;
  if (pcVar5 != pcVar1) {
    pcVar3 = pcVar5 + ~(ulong)pcVar1;
  }
  return (size_type)pcVar3;
}

Assistant:

string_view::size_type string_view::find_last_of(string_view s,
                                                 size_type pos) const noexcept {
  pos = std::min(pos, size_ - 1);
  reverse_iterator iter = std::find_first_of(
      reverse_iterator(begin() + (pos + 1)), rend(), s.begin(), s.end());
  return iter == rend() ? npos : (rend() - iter - 1);
}